

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall ON_BezierCurve::SetCV(ON_BezierCurve *this,int i,ON_4dPoint *point)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  
  if (this->m_cv == (double *)0x0) {
    bVar4 = false;
  }
  else {
    pdVar1 = this->m_cv + (long)i * (long)this->m_cv_stride;
    if (this->m_is_rat == 0) {
      dVar2 = point->w;
      bVar4 = (bool)(-(dVar2 != 0.0) & 1);
      dVar5 = 1.0 / dVar2;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        dVar5 = 1.0;
      }
      *pdVar1 = point->x * dVar5;
      iVar3 = this->m_dim;
      if (1 < iVar3) {
        pdVar1[1] = point->y * dVar5;
        if (iVar3 != 2) {
          pdVar1[2] = dVar5 * point->z;
        }
        if (3 < iVar3) {
          memset(pdVar1 + 3,0,(ulong)(iVar3 - 3) << 3);
        }
      }
    }
    else {
      *pdVar1 = point->x;
      iVar3 = this->m_dim;
      if (1 < iVar3) {
        pdVar1[1] = point->y;
        if (iVar3 != 2) {
          pdVar1[2] = point->z;
        }
        if (3 < iVar3) {
          memset(pdVar1 + 3,0,(ulong)(iVar3 - 3) << 3);
        }
      }
      pdVar1[this->m_dim] = point->w;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

double* ON_BezierCurve::CV( int i ) const
{
  return m_cv ? m_cv + (i*m_cv_stride) : 0;
}